

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::Print(TPZMHMixedMeshControl *this,ostream *out)

{
  bool bVar1;
  TPZGeoMesh *pTVar2;
  TPZCompMesh *pTVar3;
  ostream *poVar4;
  void *pvVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  int64_t iVar9;
  long *plVar10;
  ostream *in_RSI;
  long in_RDI;
  int64_t i;
  TPZManVector<long,_10> *cvec;
  TPZCompMesh *cmesh;
  iterator it_2;
  iterator it_1;
  iterator it;
  ostream *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  long lVar11;
  ostream *in_stack_ffffffffffffff58;
  long local_70;
  _Self local_58;
  _Self local_50;
  _Base_ptr local_48;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> local_30;
  _Base_ptr local_28;
  _Self local_20;
  _Self local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 8));
  if (bVar1) {
    std::operator<<(local_10,"******************* GEOMETRIC MESH *****************\n");
    pTVar2 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[9])(pTVar2,local_10);
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x1e8));
  if (bVar1) {
    std::operator<<(local_10,"******************* FLUX MESH *****************\n");
    pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->
                       ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
    (**(code **)(*(long *)pTVar3 + 0x68))(pTVar3,local_10);
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x28));
  if (bVar1) {
    std::operator<<(local_10,"******************* PRESSURE MESH *****************\n");
    pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x28))
    ;
    (**(code **)(*(long *)pTVar3 + 0x68))(pTVar3,local_10);
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x10));
  if (bVar1) {
    std::operator<<(local_10,"******************* COMPUTATIONAL MESH *****************\n");
    pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10))
    ;
    (**(code **)(*(long *)pTVar3 + 0x68))(pTVar3,local_10);
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x18));
  if (bVar1) {
    std::operator<<(local_10,"******************* LAGRANGE MULTIPLIER MESH *****************\n");
    pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x18))
    ;
    (**(code **)(*(long *)pTVar3 + 0x68))(pTVar3,local_10);
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x20));
  if (bVar1) {
    std::operator<<(local_10,"******************* CONSTANTE PRESSURE MESH *****************\n");
    pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x20))
    ;
    (**(code **)(*(long *)pTVar3 + 0x68))(pTVar3,local_10);
  }
  poVar4 = std::operator<<(local_10,"Skeleton Mat Id ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,*(int *)(in_RDI + 0x38));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_10,"Lagrange mat id left - right ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(in_RDI + 0x44));
  poVar4 = std::operator<<(poVar4," - ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,*(int *)(in_RDI + 0x48));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_10,"Internal polynomial order ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,*(int *)(in_RDI + 0xb0));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_10,"Skeleton polynomial order ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,*(int *)(in_RDI + 0xb4));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_10,"Geometric element indices of the coarse mesh ");
  local_18._M_node =
       (_Base_ptr)
       std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::begin
                 ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *
                  )in_stack_ffffffffffffff48);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                   ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_18,&local_20);
    poVar4 = local_10;
    if (!bVar1) break;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1f6129e);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar6->first);
    poVar4 = std::operator<<(poVar4," ");
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1f612cc);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar6->second);
    std::operator<<(poVar4," ");
    local_28 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)
                          in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20))
    ;
  }
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_10,
                  "Skeleton element indices with associated left and right coarse element indices\n"
                 );
  std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::_Rb_tree_iterator
            (&local_30);
  local_38 = (_Base_ptr)
             std::
             map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
             ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                      *)in_stack_ffffffffffffff48);
  local_30._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    in_stack_ffffffffffffff58 = std::operator<<(local_10,"skel index ");
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f613ba);
    poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff58,ppVar7->first);
    poVar4 = std::operator<<(poVar4," Left Right indices ");
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f613e8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ppVar7->second).first);
    poVar4 = std::operator<<(poVar4," ");
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f61417);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,(ppVar7->second).second);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    local_48 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                          in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20))
    ;
  }
  poVar4 = std::operator<<(local_10,"Will generate a constant pressure mesh ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,(bool)(*(byte *)(in_RDI + 0x1c8) & 1));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_10,"Subdomain indices of the connects by mesh\n");
  local_50._M_node =
       (_Base_ptr)
       std::
       map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
       ::begin((map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
                *)in_stack_ffffffffffffff48);
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
         ::end((map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
                *)in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    ppVar8 = std::_Rb_tree_iterator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>::
             operator->((_Rb_tree_iterator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>
                         *)0x1f614ea);
    pTVar3 = ppVar8->first;
    ppVar8 = std::_Rb_tree_iterator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>::
             operator->((_Rb_tree_iterator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>
                         *)0x1f614fc);
    poVar4 = std::operator<<(local_10,"Computational mesh pointer ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,pTVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    local_70 = 0;
    while (lVar11 = local_70, iVar9 = TPZVec<long>::size(&(ppVar8->second).super_TPZVec<long>),
          lVar11 < iVar9) {
      if ((local_70 != 0) && (local_70 % 0x14 == 0)) {
        std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
      }
      poVar4 = std::operator<<(local_10,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_70);
      in_stack_ffffffffffffff48 = std::operator<<(poVar4,"->");
      plVar10 = TPZVec<long>::operator[](&(ppVar8->second).super_TPZVec<long>,local_70);
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff48,*plVar10);
      std::operator<<(poVar4,") ");
      local_70 = local_70 + 1;
    }
    std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_> *)
               in_stack_ffffffffffffff58,(int)((ulong)lVar11 >> 0x20));
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::Print(std::ostream &out)
{
    
    /// geometric mesh used to create the computational mesh
    if (fGMesh)
    {
        out << "******************* GEOMETRIC MESH *****************\n";
        fGMesh->Print(out);
    }
    
    /// computational mesh to contain the pressure elements
    // this mesh is the same as fCMesh if there are no lagrange multipliers assocated with the average pressure
    if (fFluxMesh)
    {
        out << "******************* FLUX MESH *****************\n";
        fFluxMesh->Print(out);
    }
    
    /// computational mesh to contain the pressure elements
    // this mesh is the same as fCMesh if there are no lagrange multipliers assocated with the average pressure
    if (fPressureFineMesh)
    {
        out << "******************* PRESSURE MESH *****************\n";
        fPressureFineMesh->Print(out);
    }
    
    
    /// computational MHM mesh being built by this class
    if (fCMesh)
    {
        out << "******************* COMPUTATIONAL MESH *****************\n";
        fCMesh->Print(out);
    }
    
    /// computational mesh to represent the constant states
    if (fCMeshLagrange)
    {
        out << "******************* LAGRANGE MULTIPLIER MESH *****************\n";
        fCMeshLagrange->Print(out);
    }
    
    /// computational mesh to represent the constant states
    if (fCMeshConstantPressure)
    {
        out << "******************* CONSTANTE PRESSURE MESH *****************\n";
        fCMeshConstantPressure->Print(out);
    }
    
    /// material id associated with the skeleton elements
    out << "Skeleton Mat Id " <<  fSkeletonMatId << std::endl;
    
    /// material id associated with the lagrange multiplier elements
    out << "Lagrange mat id left - right " <<  fLagrangeMatIdLeft << " - " << fLagrangeMatIdRight << std::endl;
    
    /// interpolation order of the internal elements
    out << "Internal polynomial order " <<  fpOrderInternal << std::endl;
    
    /// interpolation order of the skeleton elements
    out << "Skeleton polynomial order " << fpOrderSkeleton << std::endl;
    
    /// indices of the geometric elements which define the skeleton mesh
    {
        out << "Geometric element indices of the coarse mesh ";
        for (std::map<int64_t,int64_t>::iterator it= fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            out << it->first << " " << it->second << " ";
        }
        out << std::endl;
    }
    /// indices of the skeleton elements and their left/right elements of the skeleton mesh
    out << "Skeleton element indices with associated left and right coarse element indices\n";
    {
        std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
        for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
            out << "skel index " << it->first << " Left Right indices " << it->second.first << " " << it->second.second << std::endl;
        }
    }
    
    /// flag to determine whether a lagrange multiplier is included to force zero average pressures in the subdomains
    /**
     * when imposing average pressure to be zero, a multiphysics mesh is created
     */
    out << "Will generate a constant pressure mesh " <<  fLagrangeAveragePressure << std::endl;
    /// subdonain indices of the connects
    out << "Subdomain indices of the connects by mesh\n";
    for (auto it = fConnectToSubDomainIdentifier.begin(); it != fConnectToSubDomainIdentifier.end(); it++) {
        TPZCompMesh *cmesh = it->first;
        TPZManVector<int64_t> &cvec = it->second;
        out << "Computational mesh pointer " << (void *) cmesh << std::endl;
        for (int64_t i=0; i<cvec.size(); i++) {
            if (i && !(i%20)) {
                out << std::endl;
            }
            out << "(" << i << "->" << cvec[i] << ") ";
        }
        out << std::endl;
    }
    
}